

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

ClassDeclarationSyntax * parseClass(string *text)

{
  SourceManager *sourceManager;
  ClassDeclarationSyntax *pCVar1;
  long lVar2;
  Diagnostic *__location;
  string_view name;
  string_view source;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays_1;
  Parser parser;
  Preprocessor preprocessor;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_768;
  undefined1 local_738 [32];
  Info *local_718;
  size_t sStack_710;
  Preprocessor local_3c0;
  
  if (DAT_006f6030 != 0) {
    lVar2 = DAT_006f6030 * 0x70;
    __location = slang::diagnostics;
    do {
      std::ranges::__destroy_at_fn::operator()<slang::Diagnostic>
                ((__destroy_at_fn *)&std::ranges::destroy_at,__location);
      __location = __location + 1;
      lVar2 = lVar2 + -0x70;
    } while (lVar2 != 0);
  }
  DAT_006f6030 = 0;
  sourceManager = getSourceManager();
  local_738._24_8_ = (value_type_pointer)0x0;
  local_738._0_8_ = (BumpAllocator *)0x3f;
  local_738._8_8_ = (Preprocessor *)0x1;
  local_738._16_8_ =
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_718 = (Info *)0x0;
  sStack_710 = 0;
  slang::parsing::Preprocessor::Preprocessor
            (&local_3c0,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)local_738,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)local_738);
  name._M_str = "source";
  name._M_len = 6;
  source._M_str = (text->_M_dataplus)._M_p;
  source._M_len = text->_M_string_length;
  slang::parsing::Preprocessor::pushSource(&local_3c0,source,name);
  local_768.arrays.elements_ = (value_type_pointer)0x0;
  local_768.arrays.groups_size_index = 0x3f;
  local_768.arrays.groups_size_mask = 1;
  local_768.arrays.groups_ =
       (group_type_pointer)
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  local_768.size_ctrl.ml = 0;
  local_768.size_ctrl.size = 0;
  slang::parsing::Parser::Parser((Parser *)local_738,&local_3c0,(Bag *)&local_768);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_768);
  pCVar1 = slang::parsing::Parser::parseClass((Parser *)local_738);
  slang::parsing::Parser::~Parser((Parser *)local_738);
  slang::parsing::Preprocessor::~Preprocessor(&local_3c0);
  return pCVar1;
}

Assistant:

const ClassDeclarationSyntax& parseClass(const std::string& text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Parser parser(preprocessor);
    return parser.parseClass();
}